

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenizerTests.cpp
# Opt level: O3

void __thiscall
TokenizerTest_HandlingNumbers_Test::~TokenizerTest_HandlingNumbers_Test
          (TokenizerTest_HandlingNumbers_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TokenizerTest, HandlingNumbers)
{
  std::stringstream stream{"12 14.5 0.34 0.31 0 2.43"};
  std::vector<double> numbers{12, 14.5, 0.34, 0.31, 0, 2.43};

  Tokenizer tokenizer{stream};
  for(auto num : numbers)
  {
    auto token = tokenizer.peek();
    EXPECT_FALSE(tokenizer.end());
    EXPECT_EQ(token.type, TokenType::Number);
    ASSERT_TRUE(std::holds_alternative<double>(token.value));
    EXPECT_DOUBLE_EQ(std::get<double>(token.value), num);

    EXPECT_FALSE(Token::isArithmeticOperator(token));
    EXPECT_FALSE(Token::isAssigmentOperator(token));
    EXPECT_FALSE(Token::isBinaryOperator(token));
    EXPECT_FALSE(Token::isComparisonOperator(token));
    EXPECT_FALSE(Token::isLogicalOperator(token));

    tokenizer.nextToken();
  }
  EXPECT_EQ(tokenizer.peek(), Token());
  EXPECT_TRUE(tokenizer.end());
}